

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcPresentationStyle::~IfcPresentationStyle(IfcPresentationStyle *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>)._vptr_ObjectHelper
       = (_func_int **)&PTR__IfcPresentationStyle_0085a260;
  *(undefined ***)&this->field_0x38 = &PTR__IfcPresentationStyle_0085a288;
  puVar2 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>).
             field_0x10;
  puVar1 = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>).
            field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  operator_delete(this,0x50);
  return;
}

Assistant:

IfcPresentationStyle() : Object("IfcPresentationStyle") {}